

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

size_t aead_encrypt(st_ptls_traffic_protection_t *ctx,void *output,void *input,size_t inlen,
                   uint8_t content_type)

{
  size_t sVar1;
  ptls_aead_context_t *ctx_00;
  ptls_aead_context_t *in_RCX;
  long in_RDI;
  undefined1 in_R8B;
  size_t off;
  uint8_t aad [5];
  void *in_stack_ffffffffffffffc8;
  void *pvVar2;
  undefined7 in_stack_ffffffffffffffd8;
  
  pvVar2 = (void *)0x0;
  build_aad(&stack0xffffffffffffffda,
            (long)&in_RCX->algo + *(long *)(**(long **)(in_RDI + 0x48) + 0x38) + 1);
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 1;
  ptls_aead_encrypt_init
            (in_RCX,CONCAT17(in_R8B,in_stack_ffffffffffffffd8),pvVar2,
             (size_t)in_stack_ffffffffffffffc8);
  sVar1 = ptls_aead_encrypt_update
                    (in_RCX,(void *)CONCAT17(in_R8B,in_stack_ffffffffffffffd8),pvVar2,
                     (size_t)in_stack_ffffffffffffffc8);
  pvVar2 = (void *)(sVar1 + (long)pvVar2);
  sVar1 = ptls_aead_encrypt_update
                    (in_RCX,(void *)CONCAT17(in_R8B,in_stack_ffffffffffffffd8),pvVar2,
                     (size_t)in_stack_ffffffffffffffc8);
  ctx_00 = (ptls_aead_context_t *)(sVar1 + (long)pvVar2);
  sVar1 = ptls_aead_encrypt_final(ctx_00,in_stack_ffffffffffffffc8);
  return (long)&ctx_00->algo + sVar1;
}

Assistant:

static size_t aead_encrypt(struct st_ptls_traffic_protection_t *ctx, void *output, const void *input, size_t inlen,
                           uint8_t content_type)
{
    uint8_t aad[5];
    size_t off = 0;

    build_aad(aad, inlen + 1 + ctx->aead->algo->tag_size);
    ptls_aead_encrypt_init(ctx->aead, ctx->seq++, aad, sizeof(aad));
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, input, inlen);
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, &content_type, 1);
    off += ptls_aead_encrypt_final(ctx->aead, ((uint8_t *)output) + off);

    return off;
}